

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

size_t get_page_size(void)

{
  size_t pgsz;
  
  if (get_page_size::PAGE_SIZE == 0) {
    pgsz = sysconf(0x1e);
  }
  else {
    pgsz = get_page_size::PAGE_SIZE;
  }
  get_page_size::PAGE_SIZE = pgsz;
  return pgsz;
}

Assistant:

HU_CONST_FN
static size_t
get_page_size()
{
    static size_t PAGE_SIZE = 0;
    size_t pgsz = PAGE_SIZE;
    if (hu_likely(pgsz != 0))
        return pgsz;

#if HU_OS_POSIX_P
    pgsz = (size_t) sysconf(_SC_PAGESIZE);
#elif HU_OS_WINDOWS_P
    SYSTEM_INFO sysnfo;
    GetSystemInfo(&sysnfo);
    pgsz = (size_t) sysnfo.dwPageSize;
#endif
    PAGE_SIZE = pgsz;
    return pgsz;
}